

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetMessageCallback
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,
          IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC messageCallback,void *userContextCallback)

{
  CALLBACK_TYPE CVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  IOTHUB_CLIENT_RESULT IVar4;
  char *pcVar5;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar5 = "Invalid argument - iotHubClientHandle is NULL";
    IVar4 = IOTHUB_CLIENT_INVALID_ARG;
    iVar2 = 0x799;
  }
  else {
    CVar1 = (iotHubClientHandle->messageCallback).type;
    if (messageCallback == (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC)0x0) {
      if (CVar1 == CALLBACK_TYPE_MESSAGE_ASYNC) {
        p_Var3 = xlogging_get_log_function();
        IVar4 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar5 = 
        "Invalid workflow sequence. Please unsubscribe using the IoTHubClientCore_LL_SetMessageCallback_Ex function."
        ;
        iVar2 = 0x7a8;
      }
      else {
        if (CVar1 != CALLBACK_TYPE_NONE) {
          (*iotHubClientHandle->IoTHubTransport_Unsubscribe)(iotHubClientHandle->deviceHandle);
          (iotHubClientHandle->messageCallback).type = CALLBACK_TYPE_NONE;
          (iotHubClientHandle->messageCallback).callbackSync =
               (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC)0x0;
          (iotHubClientHandle->messageCallback).callbackAsync =
               (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX)0x0;
          (iotHubClientHandle->messageCallback).userContextCallback = (void *)0x0;
          return IOTHUB_CLIENT_OK;
        }
        p_Var3 = xlogging_get_log_function();
        IVar4 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar5 = "not currently set to accept or process incoming messages.";
        iVar2 = 0x7a3;
      }
    }
    else {
      if (CVar1 != CALLBACK_TYPE_MESSAGE_ASYNC) {
        iVar2 = (*iotHubClientHandle->IoTHubTransport_Subscribe)(iotHubClientHandle->deviceHandle);
        if (iVar2 == 0) {
          (iotHubClientHandle->messageCallback).type = CALLBACK_TYPE_MESSAGE_SYNC;
          (iotHubClientHandle->messageCallback).callbackSync = messageCallback;
          (iotHubClientHandle->messageCallback).userContextCallback = userContextCallback;
          return IOTHUB_CLIENT_OK;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_SetMessageCallback",0x7c7,1,
                    "IoTHubTransport_Subscribe failed");
        }
        (iotHubClientHandle->messageCallback).type = CALLBACK_TYPE_NONE;
        (iotHubClientHandle->messageCallback).callbackSync =
             (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC)0x0;
        (iotHubClientHandle->messageCallback).callbackAsync =
             (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX)0x0;
        (iotHubClientHandle->messageCallback).userContextCallback = (void *)0x0;
        return IOTHUB_CLIENT_ERROR;
      }
      p_Var3 = xlogging_get_log_function();
      IVar4 = IOTHUB_CLIENT_ERROR;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return IOTHUB_CLIENT_ERROR;
      }
      pcVar5 = 
      "Invalid workflow sequence. Please unsubscribe using the IoTHubClientCore_LL_SetMessageCallback_Ex function before subscribing with MessageCallback."
      ;
      iVar2 = 0x7b9;
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_SetMessageCallback",iVar2,1,pcVar5);
  return IVar4;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetMessageCallback(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC messageCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;
    if (iotHubClientHandle == NULL)
    {
        LogError("Invalid argument - iotHubClientHandle is NULL");
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        if (messageCallback == NULL)
        {
            if (handleData->messageCallback.type == CALLBACK_TYPE_NONE)
            {
                LogError("not currently set to accept or process incoming messages.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else if (handleData->messageCallback.type == CALLBACK_TYPE_MESSAGE_ASYNC)
            {
                LogError("Invalid workflow sequence. Please unsubscribe using the IoTHubClientCore_LL_SetMessageCallback_Ex function.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                handleData->IoTHubTransport_Unsubscribe(handleData->deviceHandle);
                handleData->messageCallback.type = CALLBACK_TYPE_NONE;
                handleData->messageCallback.callbackSync = NULL;
                handleData->messageCallback.callbackAsync = NULL;
                handleData->messageCallback.userContextCallback = NULL;
                result = IOTHUB_CLIENT_OK;
            }
        }
        else
        {
            if (handleData->messageCallback.type == CALLBACK_TYPE_MESSAGE_ASYNC)
            {
                LogError("Invalid workflow sequence. Please unsubscribe using the IoTHubClientCore_LL_SetMessageCallback_Ex function before subscribing with MessageCallback.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                if (handleData->IoTHubTransport_Subscribe(handleData->deviceHandle) == 0)
                {
                    handleData->messageCallback.type = CALLBACK_TYPE_MESSAGE_SYNC;
                    handleData->messageCallback.callbackSync = messageCallback;
                    handleData->messageCallback.userContextCallback = userContextCallback;
                    result = IOTHUB_CLIENT_OK;
                }
                else
                {
                    LogError("IoTHubTransport_Subscribe failed");
                    handleData->messageCallback.type = CALLBACK_TYPE_NONE;
                    handleData->messageCallback.callbackSync = NULL;
                    handleData->messageCallback.callbackAsync = NULL;
                    handleData->messageCallback.userContextCallback = NULL;
                    result = IOTHUB_CLIENT_ERROR;
                }
            }
        }
    }
    return result;
}